

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void upscale_normative_and_extend_frame
               (AV1_COMMON *cm,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst)

{
  int iVar1;
  AV1_COMMON *in_RDI;
  int is_uv;
  int i;
  int num_planes;
  int in_stack_00000070;
  int in_stack_00000074;
  uint8_t *in_stack_00000078;
  int in_stack_00000084;
  uint8_t *in_stack_00000088;
  AV1_COMMON *in_stack_00000090;
  int in_stack_000000c0;
  int in_stack_ffffffffffffffcc;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffd0;
  undefined4 local_20;
  
  iVar1 = av1_num_planes(in_RDI);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    av1_upscale_normative_rows
              (in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000078,
               in_stack_00000074,in_stack_00000070,in_stack_000000c0);
  }
  aom_extend_frame_borders_c(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

static void upscale_normative_and_extend_frame(const AV1_COMMON *cm,
                                               const YV12_BUFFER_CONFIG *src,
                                               YV12_BUFFER_CONFIG *dst) {
  const int num_planes = av1_num_planes(cm);
  for (int i = 0; i < num_planes; ++i) {
    const int is_uv = (i > 0);
    av1_upscale_normative_rows(cm, src->buffers[i], src->strides[is_uv],
                               dst->buffers[i], dst->strides[is_uv], i,
                               src->crop_heights[is_uv]);
  }

  aom_extend_frame_borders(dst, num_planes);
}